

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O0

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<float>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<float> *this)

{
  bool bVar1;
  char *message;
  floating_point<float> *in_R9;
  AssertionHelper local_210;
  Fixed local_1d0;
  floating_point<float> local_48;
  floating_point<float> local_44;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam b;
  TypeParam a;
  iu_FloatingpointTest_x_iutest_x_NINF_Test<float> *this_local;
  
  iutest_ar._36_4_ = FloatingpointTest<float>::ONE ^ 0x80000000;
  iutest_ar._32_4_ = FloatingpointTest<float>::ZERO;
  iutest::detail::AlwaysZero();
  iutest::floating_point<float>::floating_point
            (&local_44,(float)iutest_ar._36_4_ / (float)iutest_ar._32_4_);
  iutest::floating_point<float>::NINF();
  iutest::internal::backward::EqHelper<false>::Compare<iutest::floating_point<float>>
            ((AssertionResult *)local_40,(EqHelper<false> *)"FloatType(a/b)","FloatType::NINF()",
             (char *)&local_44,&local_48,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x50,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}